

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void subwindows_set_flags(uint32_t *new_flags,size_t n_subwindows)

{
  ulong local_20;
  size_t j;
  size_t n_subwindows_local;
  uint32_t *new_flags_local;
  
  for (local_20 = 0; local_20 < n_subwindows; local_20 = local_20 + 1) {
    if ((angband_term[local_20] != (term *)0x0) && (window_flag[local_20] != new_flags[local_20])) {
      subwindow_set_flags((wchar_t)local_20,new_flags[local_20]);
    }
  }
  return;
}

Assistant:

void subwindows_set_flags(uint32_t *new_flags, size_t n_subwindows)
{
	size_t j;

	for (j = 0; j < n_subwindows; j++) {
		/* Dead window */
		if (!angband_term[j]) continue;

		/* Ignore non-changes */
		if (window_flag[j] != new_flags[j])
			subwindow_set_flags(j, new_flags[j]);
	}
}